

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall
QWidgetPrivate::drawWidget
          (QWidgetPrivate *this,QPaintDevice *pdev,QRegion *rgn,QPoint *offset,DrawWidgetFlags flags
          ,QPainter *sharedPainter,QWidgetRepaintManager *repaintManager)

{
  QWidgetData *pQVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  byte bVar5;
  bool bVar6;
  Int IVar7;
  Int IVar8;
  Int IVar9;
  int iVar10;
  BrushStyle BVar11;
  ulong uVar12;
  QWidgetRepaintManager *repaintManager_00;
  QDebug *pQVar13;
  QGraphicsEffectSourcePrivate *pQVar14;
  QTransform *this_00;
  void *__src;
  QPaintEngine *pQVar15;
  QColor *pQVar16;
  QPaintEnginePrivate *pQVar17;
  QBrush *pQVar18;
  QRegion *in_RDX;
  QPaintDevice *in_RSI;
  QWidgetPrivate *in_RDI;
  Int in_R8D;
  undefined1 **in_R9;
  long in_FS_OFFSET;
  byte bVar19;
  long in_stack_00000008;
  QPaintEngine *engine;
  bool skipPaintEvent;
  QPaintEngine *paintEngine;
  bool alsoInvisible;
  bool recursive;
  bool alsoOnScreen;
  QWidgetEffectSourcePrivate *sourced;
  QGraphicsEffectSource *source;
  bool onScreen;
  bool asRoot;
  QWidget *q;
  QBrush bg;
  QPainter p_5;
  QPainter p_4;
  QImage img;
  QPainter p_3;
  QPainter p_2;
  QPainter p_1;
  QRegion toBePainted;
  QPainter p;
  QWidgetPaintContext context;
  QRegion effectRgn;
  QColor tint;
  QLoggingCategoryMacroHolder<(QtMsgType)4> qt_category;
  QWidgetPrivate *in_stack_fffffffffffffc08;
  long lVar20;
  InvalidateReason reason;
  QGraphicsEffectSourcePrivate *in_stack_fffffffffffffc10;
  QWidgetPrivate *in_stack_fffffffffffffc18;
  QWidgetPrivate *in_stack_fffffffffffffc20;
  QWidgetPrivate *in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  QWidget *in_stack_fffffffffffffc38;
  QWidgetPrivate *in_stack_fffffffffffffc40;
  QWidgetPrivate *in_stack_fffffffffffffc48;
  QWidgetRepaintManager *in_stack_fffffffffffffc50;
  char *in_stack_fffffffffffffc58;
  QWidgetRepaintManager *in_stack_fffffffffffffc60;
  QPaintDevice *in_stack_fffffffffffffc68;
  QWidgetRepaintManager *in_stack_fffffffffffffc70;
  int index;
  QWidget *in_stack_fffffffffffffc78;
  QWidgetRepaintManager *in_stack_fffffffffffffc80;
  QWidgetPrivate *in_stack_fffffffffffffc88;
  QDebug *in_stack_fffffffffffffc90;
  QPaintDevice *local_358;
  undefined8 in_stack_fffffffffffffd18;
  QFlagsStorage<QWidgetPrivate::DrawWidgetFlag> flags_00;
  undefined6 in_stack_fffffffffffffd38;
  QWidgetRepaintManager *pQVar21;
  QRect local_290;
  QPixmap local_278 [24];
  QRect local_260;
  undefined1 *local_250;
  undefined1 *local_248;
  char local_240 [32];
  QRegion local_220;
  undefined8 local_218;
  undefined8 local_210;
  QRect local_208;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  QRect local_1d8;
  undefined1 *local_1c8;
  undefined1 local_1c0 [16];
  undefined1 *local_1b0;
  QRegion local_1a8;
  QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4> local_19c;
  undefined1 *local_198;
  QPoint local_190;
  char local_188 [36];
  QRect local_164;
  QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4> local_154;
  QRect local_150;
  QRegion local_140;
  QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4> local_138;
  QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4> local_134;
  QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4> local_130;
  QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4> local_12c;
  QRegion local_128;
  QRegion local_120;
  QRegion local_118;
  undefined1 *local_110;
  QRegion local_108;
  Int local_fc;
  undefined1 local_f8 [48];
  undefined1 **local_c8;
  undefined1 local_bc [16];
  QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4> local_ac;
  QRegion local_a8;
  QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4> local_a0;
  Int local_9c;
  QDebug local_78;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  QDebug local_58;
  QDebug local_50;
  QDebug local_48;
  QDebug local_40;
  QDebug local_38;
  Int local_2c;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = in_R8D;
  uVar12 = QRegion::isEmpty();
  if ((uVar12 & 1) == 0) {
    repaintManager_00 = (QWidgetRepaintManager *)q_func(in_RDI);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcWidgetPainting();
    anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)4>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)in_stack_fffffffffffffc10,
               (QLoggingCategory *)in_stack_fffffffffffffc08);
    while( true ) {
      bVar4 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_18);
      flags_00.i = (Int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
      if (!bVar4) break;
      anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)4>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)0x363cc7);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,
                 (int)((ulong)in_stack_fffffffffffffc10 >> 0x20),(char *)in_stack_fffffffffffffc08,
                 (char *)0x363ce0);
      QMessageLogger::info();
      pQVar13 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc58);
      QDebug::QDebug(&local_70,pQVar13);
      ::operator<<((QDebug *)&local_68,(QRegion *)&local_70);
      pQVar13 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc58);
      QDebug::QDebug(&local_60,pQVar13);
      ::operator<<(in_stack_fffffffffffffc90,(QWidget *)in_stack_fffffffffffffc88);
      pQVar13 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc58);
      QDebug::QDebug(&local_50,pQVar13);
      ::operator<<((QDebug *)&local_48,(QPoint *)&local_50);
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc58);
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      pQVar13 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc58);
      QDebug::QDebug(&local_40,pQVar13);
      local_9c = local_2c;
      operator<<<QFlags<QWidgetPrivate::DrawWidgetFlag>,_true>
                ((QDebug *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>)
                 SUB84((ulong)in_stack_fffffffffffffc48 >> 0x20,0));
      QDebug::~QDebug(&local_38);
      QDebug::~QDebug(&local_40);
      QDebug::~QDebug(&local_48);
      QDebug::~QDebug(&local_50);
      QDebug::~QDebug(&local_58);
      QDebug::~QDebug(&local_60);
      QDebug::~QDebug(&local_68);
      QDebug::~QDebug(&local_70);
      QDebug::~QDebug(&local_78);
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    local_a0.super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i =
         (QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>)
         QFlags<QWidgetPrivate::DrawWidgetFlag>::operator&
                   ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)in_stack_fffffffffffffc10,
                    (DrawWidgetFlag)((ulong)in_stack_fffffffffffffc08 >> 0x20));
    IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_a0);
    bVar19 = IVar7 != 0;
    bVar5 = shouldPaintOnScreen(in_stack_fffffffffffffc08);
    if ((in_RDI->graphicsEffect != (QGraphicsEffect *)0x0) &&
       (bVar4 = QGraphicsEffect::isEnabled((QGraphicsEffect *)in_stack_fffffffffffffc10), bVar4)) {
      QGraphicsEffect::d_func((QGraphicsEffect *)0x363f3c);
      pQVar14 = QGraphicsEffectSource::d_func((QGraphicsEffectSource *)0x363f55);
      if (*(long *)&pQVar14[1].field_0x8 == 0) {
        local_a8.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        local_ac.super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i =
             (QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>)
             QFlags<QWidgetPrivate::DrawWidgetFlag>::operator&
                       ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)in_stack_fffffffffffffc10,
                        (DrawWidgetFlag)((ulong)in_stack_fffffffffffffc08 >> 0x20));
        IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_ac);
        if (IVar7 == 0) {
          QRegion::QRegion(&local_a8,in_RDX);
        }
        else {
          local_bc = QRegion::boundingRect();
          QRegion::QRegion(&local_a8,(QRect *)local_bc,Rectangle);
        }
        memset(local_f8,0xaa,0x38);
        local_fc = local_2c;
        lVar20 = in_stack_00000008;
        QWidgetPaintContext::QWidgetPaintContext
                  ((QWidgetPaintContext *)
                   CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                   (QPaintDevice *)in_stack_fffffffffffffc28,(QRegion *)in_stack_fffffffffffffc20,
                   (QPoint *)in_stack_fffffffffffffc18,
                   (QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>)
                   SUB84((ulong)in_stack_fffffffffffffc38 >> 0x20,0),
                   (QPainter *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc50);
        reason = (InvalidateReason)((ulong)lVar20 >> 0x20);
        *(undefined1 **)&pQVar14[1].field_0x8 = local_f8;
        if (in_R9 == (undefined1 **)0x0) {
          (**(code **)(*(long *)in_RSI + 0x18))();
          QPaintDevice::devicePixelRatio();
          QRegion::translated((QRegion *)in_stack_fffffffffffffc28,
                              (QPoint *)in_stack_fffffffffffffc20);
          setSystemClip(in_stack_fffffffffffffc28,(QPaintEngine *)in_stack_fffffffffffffc20,
                        (qreal)in_stack_fffffffffffffc18,(QRegion *)in_stack_fffffffffffffc10);
          QRegion::~QRegion(&local_108);
          local_110 = &DAT_aaaaaaaaaaaaaaaa;
          QPainter::QPainter((QPainter *)&local_110,in_RSI);
          QPainter::translate((QPainter *)in_stack_fffffffffffffc20,
                              (QPoint *)in_stack_fffffffffffffc18);
          local_c8 = &local_110;
          (**(code **)(*(long *)in_RDI->graphicsEffect + 0x68))(in_RDI->graphicsEffect,&local_110);
          (**(code **)(*(long *)in_RSI + 0x18))();
          QRegion::QRegion(&local_118);
          setSystemClip(in_stack_fffffffffffffc28,(QPaintEngine *)in_stack_fffffffffffffc20,
                        (qreal)in_stack_fffffffffffffc18,(QRegion *)in_stack_fffffffffffffc10);
          QRegion::~QRegion(&local_118);
          QPainter::~QPainter((QPainter *)&local_110);
        }
        else {
          local_c8 = in_R9;
          this_00 = (QTransform *)QPainter::worldTransform();
          uVar12 = QTransform::operator!=(this_00,(QTransform *)&pQVar14[1].field_0x10);
          if ((uVar12 & 1) != 0) {
            QGraphicsEffectSourcePrivate::invalidateCache(in_stack_fffffffffffffc10,reason);
            __src = (void *)QPainter::worldTransform();
            memcpy(&pQVar14[1].field_0x10,__src,0x4a);
          }
          QPainter::save();
          QPainter::translate((QPainter *)in_stack_fffffffffffffc20,
                              (QPoint *)in_stack_fffffffffffffc18);
          QPainter::paintEngine();
          QPainter::device();
          QPaintDevice::devicePixelRatio();
          QRegion::translated((QRegion *)in_stack_fffffffffffffc28,
                              (QPoint *)in_stack_fffffffffffffc20);
          setSystemClip(in_stack_fffffffffffffc28,(QPaintEngine *)in_stack_fffffffffffffc20,
                        (qreal)in_stack_fffffffffffffc18,(QRegion *)in_stack_fffffffffffffc10);
          QRegion::~QRegion(&local_120);
          (**(code **)(*(long *)in_RDI->graphicsEffect + 0x68))(in_RDI->graphicsEffect,in_R9);
          QPainter::paintEngine();
          QRegion::QRegion(&local_128);
          setSystemClip(in_stack_fffffffffffffc28,(QPaintEngine *)in_stack_fffffffffffffc20,
                        (qreal)in_stack_fffffffffffffc18,(QRegion *)in_stack_fffffffffffffc10);
          QRegion::~QRegion(&local_128);
          QPainter::restore();
        }
        *(undefined8 *)&pQVar14[1].field_0x8 = 0;
        if (in_stack_00000008 != 0) {
          QWidgetRepaintManager::markNeedsFlush
                    ((QWidgetRepaintManager *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                     (QRegion *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                     (QPoint *)in_stack_fffffffffffffc28);
        }
        QWidgetPaintContext::~QWidgetPaintContext((QWidgetPaintContext *)0x3643b5);
        QRegion::~QRegion(&local_a8);
        goto LAB_00365115;
      }
    }
    local_12c.super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i =
         (QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>)
         QFlags<QWidgetPrivate::DrawWidgetFlag>::operator&
                   ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
    local_2c = (Int)local_12c.super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i;
    local_130.super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i =
         (QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>)
         QFlags<QWidgetPrivate::DrawWidgetFlag>::operator&
                   ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)in_stack_fffffffffffffc10,
                    (DrawWidgetFlag)((ulong)in_stack_fffffffffffffc08 >> 0x20));
    IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_130);
    local_134.super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i =
         (QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>)
         QFlags<QWidgetPrivate::DrawWidgetFlag>::operator&
                   ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)in_stack_fffffffffffffc10,
                    (DrawWidgetFlag)((ulong)in_stack_fffffffffffffc08 >> 0x20));
    IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_134);
    local_138.super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i =
         (QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>)
         QFlags<QWidgetPrivate::DrawWidgetFlag>::operator&
                   ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)in_stack_fffffffffffffc10,
                    (DrawWidgetFlag)((ulong)in_stack_fffffffffffffc08 >> 0x20));
    IVar9 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_138);
    local_140.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&local_140,in_RDX);
    if (((bVar19 & 1) != 0) && (IVar9 == 0)) {
      local_150 = clipRect(in_stack_fffffffffffffc48);
      QRegion::operator&=(&local_140,(QRect *)&local_150);
    }
    local_154.super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i =
         (QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>)
         QFlags<QWidgetPrivate::DrawWidgetFlag>::operator&
                   ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)in_stack_fffffffffffffc10,
                    (DrawWidgetFlag)((ulong)in_stack_fffffffffffffc08 >> 0x20));
    bVar4 = QFlags<QWidgetPrivate::DrawWidgetFlag>::operator!
                      ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)&local_154);
    if (bVar4) {
      local_164 = QWidget::rect((QWidget *)in_stack_fffffffffffffc28);
      subtractOpaqueChildren
                (in_stack_fffffffffffffc20,(QRegion *)in_stack_fffffffffffffc18,
                 (QRect *)in_stack_fffffffffffffc10);
    }
    uVar12 = QRegion::isEmpty();
    if ((uVar12 & 1) == 0) {
      if (((bVar5 & 1) == 0) || (IVar7 != 0)) {
        bVar4 = QWidget::testAttribute
                          ((QWidget *)in_stack_fffffffffffffc18,
                           (WidgetAttribute)((ulong)in_stack_fffffffffffffc10 >> 0x20));
        if (bVar4) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,
                     (int)((ulong)in_stack_fffffffffffffc10 >> 0x20),
                     (char *)in_stack_fffffffffffffc08);
          QMessageLogger::warning(local_188,"QWidget::repaint: Recursive repaint detected");
        }
        QWidget::setAttribute
                  (in_stack_fffffffffffffc78,
                   (WidgetAttribute)((ulong)in_stack_fffffffffffffc70 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffc70 >> 0x18,0));
        pQVar15 = (QPaintEngine *)(**(code **)(*(long *)in_RSI + 0x18))();
        if (pQVar15 != (QPaintEngine *)0x0) {
          local_190 = ::operator-((QPoint *)in_stack_fffffffffffffc10);
          setRedirected(in_RDI,in_RSI,&local_190);
          if (in_R9 == (undefined1 **)0x0) {
            pQVar1 = (QWidgetData *)(repaintManager_00->dirtyWidgets).d.ptr;
            pQVar17 = QPaintEngine::d_func((QPaintEngine *)0x3646c0);
            *(undefined8 *)(pQVar17 + 0x28) = *(undefined8 *)&pQVar1->crect;
            *(undefined8 *)(pQVar17 + 0x30) = *(undefined8 *)&(pQVar1->crect).x2;
          }
          else {
            (**(code **)(*(long *)in_RSI + 0x18))();
            QPaintDevice::devicePixelRatio();
            setSystemClip(in_stack_fffffffffffffc28,(QPaintEngine *)in_stack_fffffffffffffc20,
                          (qreal)in_stack_fffffffffffffc18,(QRegion *)in_stack_fffffffffffffc10);
          }
          if ((((((bVar19 & 1) != 0) ||
                (bVar4 = QWidget::autoFillBackground((QWidget *)in_stack_fffffffffffffc10), bVar4))
               || ((bVar5 & 1) != 0)) ||
              (bVar4 = QWidget::testAttribute
                                 ((QWidget *)in_stack_fffffffffffffc18,
                                  (WidgetAttribute)((ulong)in_stack_fffffffffffffc10 >> 0x20)),
              bVar4)) &&
             ((bVar4 = QWidget::testAttribute
                                 ((QWidget *)in_stack_fffffffffffffc18,
                                  (WidgetAttribute)((ulong)in_stack_fffffffffffffc10 >> 0x20)),
              !bVar4 && (bVar4 = QWidget::testAttribute
                                           ((QWidget *)in_stack_fffffffffffffc18,
                                            (WidgetAttribute)
                                            ((ulong)in_stack_fffffffffffffc10 >> 0x20)), !bVar4))))
          {
            (**(code **)(*(long *)in_RDI + 0x60))();
            local_198 = &DAT_aaaaaaaaaaaaaaaa;
            local_358 = (QPaintDevice *)0x0;
            if (repaintManager_00 != (QWidgetRepaintManager *)0x0) {
              local_358 = (QPaintDevice *)&repaintManager_00->dirty;
            }
            QPainter::QPainter((QPainter *)&local_198,local_358);
            QPainter::setRenderHint((RenderHint)&local_198,true);
            if (((bVar19 & 1) == 0) && ((bVar5 & 1) == 0)) {
              memset(&local_19c,0,4);
              QFlags<QWidgetPrivate::DrawWidgetFlag>::QFlags
                        ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)0x364819);
            }
            else {
              local_19c.super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i =
                   (QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>)
                   QFlags<QWidgetPrivate::DrawWidgetFlag>::operator|
                             ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)in_stack_fffffffffffffc10,
                              (DrawWidgetFlag)((ulong)in_stack_fffffffffffffc08 >> 0x20));
            }
            paintBackground(in_stack_fffffffffffffc40,(QPainter *)in_stack_fffffffffffffc38,
                            (QRegion *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30)
                            ,(QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>)
                             SUB84((ulong)in_stack_fffffffffffffc68 >> 0x20,0));
            (**(code **)(*(long *)in_RDI + 0x68))();
            QPainter::~QPainter((QPainter *)&local_198);
          }
          if (in_R9 == (undefined1 **)0x0) {
            (**(code **)(*(long *)in_RSI + 0x18))();
            QPaintDevice::devicePixelRatio();
            QRegion::translated((QRegion *)in_stack_fffffffffffffc28,
                                (QPoint *)in_stack_fffffffffffffc20);
            setSystemClip(in_stack_fffffffffffffc28,(QPaintEngine *)in_stack_fffffffffffffc20,
                          (qreal)in_stack_fffffffffffffc18,(QRegion *)in_stack_fffffffffffffc10);
            QRegion::~QRegion(&local_1a8);
          }
          auVar3._8_8_ = local_1c0._8_8_;
          auVar3._0_8_ = local_1c0._0_8_;
          auVar2._8_8_ = local_1c0._8_8_;
          auVar2._0_8_ = local_1c0._0_8_;
          if ((((bVar5 & 1) == 0) && (local_1c0 = auVar2, (bVar19 & 1) == 0)) &&
             (local_1c0 = auVar3, (*(uint *)&in_RDI->field_0x250 >> 0x11 & 1) == 0)) {
            bVar4 = QWidget::testAttribute
                              ((QWidget *)in_stack_fffffffffffffc18,
                               (WidgetAttribute)((ulong)in_stack_fffffffffffffc10 >> 0x20));
            if (bVar4) {
              in_stack_fffffffffffffc80 = repaintManager_00;
              (**(code **)(*(long *)in_RDI + 0x60))();
              local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
              in_stack_fffffffffffffc88 = (QWidgetPrivate *)0x0;
              if (in_stack_fffffffffffffc80 != (QWidgetRepaintManager *)0x0) {
                in_stack_fffffffffffffc88 = (QWidgetPrivate *)&in_stack_fffffffffffffc80->dirty;
              }
              repaintManager_00 = in_stack_fffffffffffffc80;
              QPainter::QPainter((QPainter *)&local_1b0,(QPaintDevice *)in_stack_fffffffffffffc88);
              local_28 = &DAT_aaaaaaaaaaaaaaaa;
              local_20 = &DAT_aaaaaaaaaaaaaaaa;
              QWidget::palette((QWidget *)in_stack_fffffffffffffc10);
              QPalette::window((QPalette *)0x3649c6);
              pQVar16 = QBrush::color((QBrush *)0x3649ce);
              local_28 = *(undefined1 **)pQVar16;
              local_20 = *(undefined1 **)((long)&pQVar16->ct + 4);
              QColor::setAlphaF(0.6);
              local_1c0 = QRegion::boundingRect();
              QPainter::fillRect((QRect *)&local_1b0,(QColor *)local_1c0);
              (**(code **)(*(long *)in_RDI + 0x68))();
              QPainter::~QPainter((QPainter *)&local_1b0);
            }
          }
        }
        bVar4 = false;
        if ((*(uint *)&in_RDI->field_0x250 >> 0x18 & 1) != 0) {
          (**(code **)(*(long *)in_RDI + 0x60))();
          bVar6 = QWidget::testAttribute
                            ((QWidget *)in_stack_fffffffffffffc18,
                             (WidgetAttribute)((ulong)in_stack_fffffffffffffc10 >> 0x20));
          if ((bVar6) || (in_stack_00000008 == 0)) {
            if (in_stack_00000008 == 0) {
              local_1f0 = &DAT_aaaaaaaaaaaaaaaa;
              local_1e8 = &DAT_aaaaaaaaaaaaaaaa;
              local_1e0 = &DAT_aaaaaaaaaaaaaaaa;
              (**(code **)(*(long *)in_RDI + 0x58))(&local_1f0);
              iVar10 = QImage::format();
              in_stack_fffffffffffffc60 = repaintManager_00;
              if (iVar10 == 4) {
                QImage::reinterpretAsFormat((Format)&local_1f0);
                in_stack_fffffffffffffc60 = repaintManager_00;
              }
              local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
              in_stack_fffffffffffffc68 = (QPaintDevice *)0x0;
              if (in_stack_fffffffffffffc60 != (QWidgetRepaintManager *)0x0) {
                in_stack_fffffffffffffc68 = (QPaintDevice *)&in_stack_fffffffffffffc60->dirty;
              }
              repaintManager_00 = in_stack_fffffffffffffc60;
              QPainter::QPainter((QPainter *)&local_1f8,in_stack_fffffffffffffc68);
              local_208 = QWidget::rect((QWidget *)in_stack_fffffffffffffc28);
              QPainter::drawImage((QPainter *)in_stack_fffffffffffffc40,
                                  (QRect *)in_stack_fffffffffffffc38,
                                  (QImage *)
                                  CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
              bVar4 = true;
              QPainter::~QPainter((QPainter *)&local_1f8);
              QImage::~QImage((QImage *)&local_1f0);
            }
          }
          else {
            local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
            in_stack_fffffffffffffc78 = (QWidget *)0x0;
            if (repaintManager_00 != (QWidgetRepaintManager *)0x0) {
              in_stack_fffffffffffffc78 = (QWidget *)&repaintManager_00->dirty;
            }
            pQVar21 = repaintManager_00;
            QPainter::QPainter((QPainter *)&local_1c8,(QPaintDevice *)in_stack_fffffffffffffc78);
            QPainter::setCompositionMode((CompositionMode)&local_1c8);
            local_1d8 = QWidget::rect((QWidget *)in_stack_fffffffffffffc28);
            QPainter::fillRect((QPainter *)in_stack_fffffffffffffc28,
                               (QRect *)in_stack_fffffffffffffc20,
                               (GlobalColor)((ulong)in_stack_fffffffffffffc18 >> 0x20));
            QPainter::~QPainter((QPainter *)&local_1c8);
            in_stack_fffffffffffffc70 = repaintManager_00;
            repaintManager_00 = pQVar21;
          }
          (**(code **)(*(long *)in_RDI + 0x68))();
          if ((*(uint *)&in_RDI->field_0x250 >> 0x1b & 1) == 0) {
            bVar4 = true;
          }
          else {
            *(uint *)&in_RDI->field_0x250 = *(uint *)&in_RDI->field_0x250 & 0xf7ffffff;
          }
        }
        if (!bVar4) {
          sendPaintEvent(in_stack_fffffffffffffc18,(QRegion *)in_stack_fffffffffffffc10);
        }
        if (in_stack_00000008 != 0) {
          QWidgetRepaintManager::markNeedsFlush
                    ((QWidgetRepaintManager *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                     (QRegion *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                     (QPoint *)in_stack_fffffffffffffc28);
        }
        if (pQVar15 != (QPaintEngine *)0x0) {
          restoreRedirected(in_RDI);
          if (in_R9 == (undefined1 **)0x0) {
            QRect::QRect((QRect *)in_stack_fffffffffffffc10);
            pQVar17 = QPaintEngine::d_func((QPaintEngine *)0x364d4e);
            *(undefined8 *)(pQVar17 + 0x28) = local_218;
            *(undefined8 *)(pQVar17 + 0x30) = local_210;
          }
          else {
            pQVar17 = QPaintEngine::d_func((QPaintEngine *)0x364d75);
            *(undefined8 *)(pQVar17 + 0x90) = 0;
          }
          (**(code **)(*(long *)in_RSI + 0x18))();
          QRegion::QRegion(&local_220);
          setSystemClip(in_stack_fffffffffffffc28,(QPaintEngine *)in_stack_fffffffffffffc20,
                        (qreal)in_stack_fffffffffffffc18,(QRegion *)in_stack_fffffffffffffc10);
          QRegion::~QRegion(&local_220);
        }
        QWidget::setAttribute
                  (in_stack_fffffffffffffc78,
                   (WidgetAttribute)((ulong)in_stack_fffffffffffffc70 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffc70 >> 0x18,0));
        bVar4 = QPaintDevice::paintingActive((QPaintDevice *)&repaintManager_00->dirty);
        if (bVar4) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,
                     (int)((ulong)in_stack_fffffffffffffc10 >> 0x20),
                     (char *)in_stack_fffffffffffffc08);
          QMessageLogger::warning
                    (local_240,
                     "QWidget::repaint: It is dangerous to leave painters active on a widget outside of the PaintEvent"
                    );
        }
        if (pQVar15 != (QPaintEngine *)0x0) {
          bVar4 = QPaintEngine::autoDestruct(pQVar15);
          if ((bVar4) && (pQVar15 != (QPaintEngine *)0x0)) {
            (**(code **)(*(long *)pQVar15 + 8))();
          }
        }
        flags_00.i = (Int)((ulong)pQVar15 >> 0x20);
      }
      else {
        bVar4 = QWidget::isWindow((QWidget *)in_stack_fffffffffffffc10);
        if (bVar4) {
          pQVar15 = (QPaintEngine *)(**(code **)(*(long *)in_RSI + 0x18))();
          if (pQVar15 != (QPaintEngine *)0x0) {
            local_248 = &DAT_aaaaaaaaaaaaaaaa;
            QPainter::QPainter((QPainter *)&local_248,in_RSI);
            QPainter::setClipRegion((QRegion *)&local_248,(ClipOperation)&local_140);
            local_250 = &DAT_aaaaaaaaaaaaaaaa;
            QWidget::palette((QWidget *)in_stack_fffffffffffffc10);
            pQVar18 = QPalette::brush((QPalette *)in_stack_fffffffffffffc10,
                                      (ColorRole)((ulong)in_stack_fffffffffffffc08 >> 0x20));
            QBrush::QBrush((QBrush *)&local_250,pQVar18);
            BVar11 = QBrush::style((QBrush *)0x364f2c);
            if (BVar11 == TexturePattern) {
              local_260 = QWidget::rect((QWidget *)in_stack_fffffffffffffc28);
              QBrush::texture();
              QPoint::QPoint((QPoint *)in_stack_fffffffffffffc10);
              QPainter::drawTiledPixmap
                        ((QPainter *)in_stack_fffffffffffffc38,
                         (QRect *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                         (QPixmap *)in_stack_fffffffffffffc28,(QPoint *)in_stack_fffffffffffffc20);
              QPixmap::~QPixmap(local_278);
            }
            else {
              local_290 = QWidget::rect((QWidget *)in_stack_fffffffffffffc28);
              QPainter::fillRect((QRect *)&local_248,(QBrush *)&local_290);
            }
            bVar4 = QPaintEngine::autoDestruct(pQVar15);
            if ((bVar4) && (pQVar15 != (QPaintEngine *)0x0)) {
              (**(code **)(*(long *)pQVar15 + 8))();
            }
            QBrush::~QBrush((QBrush *)&local_250);
            QPainter::~QPainter((QPainter *)&local_248);
          }
        }
      }
    }
    index = (int)((ulong)in_stack_fffffffffffffc70 >> 0x20);
    iVar10 = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
    if (IVar8 != 0) {
      bVar4 = QList<QObject_*>::isEmpty((QList<QObject_*> *)0x365050);
      if (!bVar4) {
        QList<QObject_*>::size((QList<QObject_*> *)&in_RDI->field_0x18);
        QFlags<QWidgetPrivate::DrawWidgetFlag>::operator&
                  ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)in_stack_fffffffffffffc10,iVar10);
        paintSiblingsRecursive
                  (in_stack_fffffffffffffc88,(QPaintDevice *)in_stack_fffffffffffffc80,
                   (QObjectList *)in_stack_fffffffffffffc78,index,
                   (QRegion *)in_stack_fffffffffffffc68,(QPoint *)in_stack_fffffffffffffc60,
                   (DrawWidgetFlags)flags_00.i,
                   (QPainter *)CONCAT17(bVar19,CONCAT16(bVar5,in_stack_fffffffffffffd38)),
                   repaintManager_00);
      }
    }
    QRegion::~QRegion(&local_140);
  }
LAB_00365115:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::drawWidget(QPaintDevice *pdev, const QRegion &rgn, const QPoint &offset, DrawWidgetFlags flags,
                                QPainter *sharedPainter, QWidgetRepaintManager *repaintManager)
{
    if (rgn.isEmpty())
        return;

    Q_Q(QWidget);

    qCInfo(lcWidgetPainting) << "Drawing" << rgn << "of" << q << "at" << offset
        << "into paint device" << pdev << "with" << flags;

    const bool asRoot = flags & DrawAsRoot;
    bool onScreen = shouldPaintOnScreen();

#if QT_CONFIG(graphicseffect)
    if (graphicsEffect && graphicsEffect->isEnabled()) {
        QGraphicsEffectSource *source = graphicsEffect->d_func()->source;
        QWidgetEffectSourcePrivate *sourced = static_cast<QWidgetEffectSourcePrivate *>
                                                         (source->d_func());
        if (!sourced->context) {
            const QRegion effectRgn((flags & UseEffectRegionBounds) ? rgn.boundingRect() : rgn);
            QWidgetPaintContext context(pdev, effectRgn, offset, flags, sharedPainter, repaintManager);
            sourced->context = &context;
            if (!sharedPainter) {
                setSystemClip(pdev->paintEngine(), pdev->devicePixelRatio(), effectRgn.translated(offset));
                QPainter p(pdev);
                p.translate(offset);
                context.painter = &p;
                graphicsEffect->draw(&p);
                setSystemClip(pdev->paintEngine(), 1, QRegion());
            } else {
                context.painter = sharedPainter;
                if (sharedPainter->worldTransform() != sourced->lastEffectTransform) {
                    sourced->invalidateCache();
                    sourced->lastEffectTransform = sharedPainter->worldTransform();
                }
                sharedPainter->save();
                sharedPainter->translate(offset);
                setSystemClip(sharedPainter->paintEngine(), sharedPainter->device()->devicePixelRatio(), effectRgn.translated(offset));
                graphicsEffect->draw(sharedPainter);
                setSystemClip(sharedPainter->paintEngine(), 1, QRegion());
                sharedPainter->restore();
            }
            sourced->context = nullptr;

            if (repaintManager)
                repaintManager->markNeedsFlush(q, effectRgn, offset);

            return;
        }
    }
#endif // QT_CONFIG(graphicseffect)
    flags = flags & ~UseEffectRegionBounds;

    const bool alsoOnScreen = flags & DrawPaintOnScreen;
    const bool recursive = flags & DrawRecursive;
    const bool alsoInvisible = flags & DrawInvisible;

    Q_ASSERT(sharedPainter ? sharedPainter->isActive() : true);

    QRegion toBePainted(rgn);
    if (asRoot && !alsoInvisible)
        toBePainted &= clipRect(); //(rgn & visibleRegion());
    if (!(flags & DontSubtractOpaqueChildren))
        subtractOpaqueChildren(toBePainted, q->rect());

    if (!toBePainted.isEmpty()) {
        if (!onScreen || alsoOnScreen) {
            //update the "in paint event" flag
            if (Q_UNLIKELY(q->testAttribute(Qt::WA_WState_InPaintEvent)))
                qWarning("QWidget::repaint: Recursive repaint detected");
            q->setAttribute(Qt::WA_WState_InPaintEvent);

            //clip away the new area
            QPaintEngine *paintEngine = pdev->paintEngine();
            if (paintEngine) {
                setRedirected(pdev, -offset);

                if (sharedPainter)
                    setSystemClip(pdev->paintEngine(), pdev->devicePixelRatio(), toBePainted);
                else
                    paintEngine->d_func()->systemRect = q->data->crect;

                //paint the background
                if ((asRoot || q->autoFillBackground() || onScreen || q->testAttribute(Qt::WA_StyledBackground))
                    && !q->testAttribute(Qt::WA_OpaquePaintEvent) && !q->testAttribute(Qt::WA_NoSystemBackground)) {
                    beginBackingStorePainting();
                    QPainter p(q);
                    p.setRenderHint(QPainter::SmoothPixmapTransform);
                    paintBackground(&p, toBePainted, (asRoot || onScreen) ? (flags | DrawAsRoot) : DrawWidgetFlags());
                    endBackingStorePainting();
                }

                if (!sharedPainter)
                    setSystemClip(pdev->paintEngine(), pdev->devicePixelRatio(), toBePainted.translated(offset));

                if (!onScreen && !asRoot && !isOpaque && q->testAttribute(Qt::WA_TintedBackground)) {
                    beginBackingStorePainting();
                    QPainter p(q);
                    QColor tint = q->palette().window().color();
                    tint.setAlphaF(.6f);
                    p.fillRect(toBePainted.boundingRect(), tint);
                    endBackingStorePainting();
                }
            }

#if 0
            qDebug() << "painting" << q << "opaque ==" << isOpaque();
            qDebug() << "clipping to" << toBePainted << "location == " << offset
                     << "geometry ==" << QRect(q->mapTo(q->window(), QPoint(0, 0)), q->size());
#endif

            bool skipPaintEvent = false;
            if (renderToTexture) {
                // This widget renders into a texture which is composed later. We just need to
                // punch a hole in the backingstore, so the texture will be visible.
                beginBackingStorePainting();
                if (!q->testAttribute(Qt::WA_AlwaysStackOnTop) && repaintManager) {
                    QPainter p(q);
                    p.setCompositionMode(QPainter::CompositionMode_Source);
                    p.fillRect(q->rect(), Qt::transparent);
                } else if (!repaintManager) {
                    // We are not drawing to a backingstore: fall back to QImage
                    QImage img = grabFramebuffer();
                    // grabFramebuffer() always sets the format to RGB32
                    // regardless of whether it is transparent or not.
                    if (img.format() == QImage::Format_RGB32)
                        img.reinterpretAsFormat(QImage::Format_ARGB32_Premultiplied);
                    QPainter p(q);
                    p.drawImage(q->rect(), img);
                    skipPaintEvent = true;
                }
                endBackingStorePainting();
                if (renderToTextureReallyDirty)
                    renderToTextureReallyDirty = 0;
                else
                    skipPaintEvent = true;
            }

            if (!skipPaintEvent) {
                //actually send the paint event
                sendPaintEvent(toBePainted);
            }

            if (repaintManager)
                repaintManager->markNeedsFlush(q, toBePainted, offset);

            //restore
            if (paintEngine) {
                restoreRedirected();
                if (!sharedPainter)
                    paintEngine->d_func()->systemRect = QRect();
                else
                    paintEngine->d_func()->currentClipDevice = nullptr;

                setSystemClip(pdev->paintEngine(), 1, QRegion());
            }
            q->setAttribute(Qt::WA_WState_InPaintEvent, false);
            if (Q_UNLIKELY(q->paintingActive()))
                qWarning("QWidget::repaint: It is dangerous to leave painters active on a widget outside of the PaintEvent");

            if (paintEngine && paintEngine->autoDestruct()) {
                delete paintEngine;
            }
        } else if (q->isWindow()) {
            QPaintEngine *engine = pdev->paintEngine();
            if (engine) {
                QPainter p(pdev);
                p.setClipRegion(toBePainted);
                const QBrush bg = q->palette().brush(QPalette::Window);
                if (bg.style() == Qt::TexturePattern)
                    p.drawTiledPixmap(q->rect(), bg.texture());
                else
                    p.fillRect(q->rect(), bg);

                if (engine->autoDestruct())
                    delete engine;
            }
        }
    }

    if (recursive && !children.isEmpty()) {
        paintSiblingsRecursive(pdev, children, children.size() - 1, rgn, offset, flags & ~DrawAsRoot,
                               sharedPainter, repaintManager);
    }
}